

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O2

int WallMost(short *mostbuf,secplane_t *plane,FWallCoords *wallc)

{
  int iVar1;
  undefined8 uVar2;
  double dVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  SWORD *b2;
  vertex_t *pvVar7;
  SWORD *b2_1;
  int iVar8;
  ulong uVar9;
  DWORD count;
  int iVar10;
  int iVar11;
  short sVar12;
  int iVar13;
  float fVar14;
  undefined4 uVar15;
  uint uVar16;
  undefined4 uVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  float fVar25;
  double dVar26;
  double dVar27;
  double local_70;
  
  sVar4 = (short)viewheight;
  dVar26 = (plane->normal).X;
  dVar19 = (plane->normal).Y;
  if (dVar19 == 0.0 && dVar26 == 0.0) {
    iVar13 = OWallMost(mostbuf,plane->D * plane->negiC - ViewPos.Z,wallc);
    return iVar13;
  }
  if (((byte)MirrorFlags & 1) == 0) {
    dVar22 = (curline->v1->p).X;
    dVar27 = (curline->v1->p).Y;
    iVar13 = (int)wallc->sx1;
    dVar21 = dVar22;
    dVar20 = dVar27;
    if (wallc->sx1 == 0) {
      uVar2 = *(undefined8 *)&(wallc->tleft).Y;
      fVar14 = (wallc->tleft).X + (float)uVar2;
      fVar18 = fVar14 - ((wallc->tright).Y + (float)((ulong)uVar2 >> 0x20));
      if (fVar18 != 0.0) {
        dVar20 = (double)fVar14 / (double)fVar18;
        dVar21 = dVar20 * ((curline->v2->p).X - dVar22) + dVar22;
        dVar20 = dVar20 * ((curline->v2->p).Y - dVar27) + dVar27;
      }
    }
    dVar23 = plane->D;
    dVar24 = plane->negiC;
    uVar15 = SUB84(dVar24,0);
    uVar17 = (undefined4)((ulong)dVar24 >> 0x20);
    dVar20 = ViewPos.Z - (dVar20 * dVar19 + dVar21 * dVar26 + dVar23) * dVar24;
    iVar10 = (int)wallc->sx2;
    dVar21 = dVar20;
    if (iVar10 <= iVar13 + 1) goto LAB_0033167b;
    pvVar7 = curline->v2;
  }
  else {
    dVar22 = (curline->v2->p).X;
    dVar27 = (curline->v2->p).Y;
    iVar13 = (int)wallc->sx1;
    dVar21 = dVar22;
    dVar20 = dVar27;
    if (wallc->sx1 == 0) {
      uVar2 = *(undefined8 *)&(wallc->tleft).Y;
      fVar14 = (wallc->tleft).X + (float)uVar2;
      fVar18 = fVar14 - ((wallc->tright).Y + (float)((ulong)uVar2 >> 0x20));
      if (fVar18 != 0.0) {
        dVar20 = (double)fVar14 / (double)fVar18;
        dVar21 = dVar20 * ((curline->v1->p).X - dVar22) + dVar22;
        dVar20 = dVar20 * ((curline->v1->p).Y - dVar27) + dVar27;
      }
    }
    dVar23 = plane->D;
    dVar24 = plane->negiC;
    uVar15 = SUB84(dVar24,0);
    uVar17 = (undefined4)((ulong)dVar24 >> 0x20);
    dVar20 = ViewPos.Z - (dVar20 * dVar19 + dVar21 * dVar26 + dVar23) * dVar24;
    iVar10 = (int)wallc->sx2;
    dVar21 = dVar20;
    if (iVar10 <= iVar13 + 1) goto LAB_0033167b;
    pvVar7 = curline->v1;
  }
  dVar20 = (pvVar7->p).X;
  dVar24 = (pvVar7->p).Y;
  if (viewwidth == iVar10) {
    fVar14 = (wallc->tright).X;
    fVar18 = (wallc->tright).Y;
    fVar25 = ((wallc->tleft).X - ((wallc->tleft).Y + fVar14)) + fVar18;
    if (fVar25 != 0.0) {
      dVar3 = (double)(fVar18 - fVar14) / (double)fVar25;
      dVar20 = dVar20 + dVar3 * (dVar22 - dVar20);
      dVar24 = dVar24 + dVar3 * (dVar27 - dVar24);
    }
  }
  dVar20 = ViewPos.Z -
           (dVar24 * dVar19 + dVar23 + dVar20 * dVar26) * (double)CONCAT44(uVar17,uVar15);
LAB_0033167b:
  dVar26 = (double)wallc->sz1;
  dVar19 = globaluclip * dVar26;
  local_70 = (double)wallc->sz2;
  dVar27 = globaldclip * dVar26;
  dVar22 = globaldclip * local_70;
  iVar5 = (uint)(dVar21 < dVar19) + (uint)(dVar20 < globaluclip * local_70) * 2;
  iVar11 = (uint)(dVar22 < dVar20) * 8 + (uint)(dVar27 < dVar21) * 4;
  sVar12 = (short)iVar13;
  if (iVar5 == 3) {
    memset(mostbuf + sVar12,0,(long)(iVar10 - iVar13) * 2);
  }
  else if (iVar11 == 0xc) {
    for (uVar9 = 0; (uint)(iVar10 - iVar13) != uVar9; uVar9 = uVar9 + 1) {
      mostbuf[(long)sVar12 + uVar9] = sVar4;
    }
  }
  else {
    uVar15 = SUB84(dVar21,0);
    uVar17 = (undefined4)((ulong)dVar21 >> 0x20);
    dVar23 = dVar20;
    if (iVar5 != 0) {
      dVar23 = (dVar21 - dVar19) / ((dVar21 - (dVar19 + dVar20)) + globaluclip * local_70);
      dVar19 = (double)(wallc->sz2 - wallc->sz1) * dVar23 + dVar26;
      iVar6 = SUB84(((double)(iVar10 - iVar13) * local_70 * dVar23) / dVar19 + 6755399441055744.0,0)
      ;
      dVar23 = (dVar20 - dVar21) * dVar23 + dVar21;
      iVar1 = iVar13 + iVar6;
      if (iVar5 == 2) {
        iVar8 = iVar1;
        if (iVar6 < 0) {
          dVar23 = dVar20;
          dVar19 = local_70;
          iVar8 = iVar10;
        }
        local_70 = dVar19;
        memset(mostbuf + iVar1,0,(long)(iVar10 - iVar1) * 2);
        iVar10 = iVar8;
      }
      else {
        if (iVar10 < iVar1) {
          dVar23 = dVar21;
          iVar1 = iVar13;
          dVar19 = dVar26;
        }
        dVar26 = dVar19;
        iVar13 = iVar1;
        memset(mostbuf + sVar12,0,(long)iVar6 * 2);
        uVar15 = SUB84(dVar23,0);
        uVar17 = (undefined4)((ulong)dVar23 >> 0x20);
        dVar23 = dVar20;
      }
    }
    sVar4 = (short)viewheight;
    dVar19 = (double)CONCAT44(uVar17,uVar15);
    if (iVar11 != 0) {
      dVar27 = (dVar21 - dVar27) / ((dVar22 + dVar21) - (dVar27 + dVar20));
      dVar22 = (double)(wallc->sz2 - wallc->sz1) * dVar27 + (double)wallc->sz1;
      iVar8 = (int)wallc->sx1;
      iVar6 = (int)wallc->sx2;
      uVar16 = SUB84(((double)(iVar6 - iVar8) * (double)wallc->sz2 * dVar27) / dVar22 +
                     6755399441055744.0,0);
      dVar21 = (dVar20 - dVar21) * dVar27 + dVar21;
      iVar1 = uVar16 + iVar8;
      if (iVar11 == 8) {
        if (-1 < (int)uVar16) {
          dVar23 = dVar21;
          local_70 = dVar22;
          iVar10 = iVar1;
        }
        if (iVar6 - iVar1 != 0 && iVar1 <= iVar6) {
          for (uVar9 = 0; (uint)(iVar6 - iVar1) != uVar9; uVar9 = uVar9 + 1) {
            mostbuf[(long)iVar1 + uVar9] = sVar4;
          }
        }
      }
      else {
        if (iVar1 <= iVar6) {
          dVar19 = dVar21;
          dVar26 = dVar22;
          iVar13 = iVar1;
        }
        if (0 < (int)uVar16) {
          for (uVar9 = 0; (uVar16 & 0x7fffffff) != uVar9; uVar9 = uVar9 + 1) {
            mostbuf[(long)iVar8 + uVar9] = sVar4;
          }
        }
      }
    }
    dVar26 = (dVar19 * InvZtoScale) / dVar26;
    count = iVar10 - iVar13;
    if (count == 0) {
      mostbuf[iVar10] = SUB82(dVar26 + 6755399441055744.0 + CenterY,0);
    }
    else {
      qinterpolatedown16short
                (mostbuf + iVar13,count,SUB84(dVar26 + 103079215104.0 + CenterY,0) + 0x8000,
                 SUB84(((InvZtoScale * dVar23) / local_70 - dVar26) / (double)(int)count +
                       103079215104.0,0));
    }
  }
  return iVar5 + iVar11;
}

Assistant:

int WallMost (short *mostbuf, const secplane_t &plane, const FWallCoords *wallc)
{
	if (!plane.isSlope())
	{
		return OWallMost(mostbuf, plane.Zat0() - ViewPos.Z, wallc);
	}

	double x, y, den, z1, z2, oz1, oz2;
	double s1, s2, s3, s4;
	int bad, ix1, ix2;
	double iy1, iy2;

	// Get Z coordinates at both ends of the line
	if (MirrorFlags & RF_XFLIP)
	{
		x = curline->v2->fX();
		y = curline->v2->fY();
		if (wallc->sx1 == 0 && 0 != (den = wallc->tleft.X - wallc->tright.X + wallc->tleft.Y - wallc->tright.Y))
		{
			double frac = (wallc->tleft.Y + wallc->tleft.X) / den;
			x -= frac * (x - curline->v1->fX());
			y -= frac * (y - curline->v1->fY());
		}
		z1 = ViewPos.Z - plane.ZatPoint(x, y);

		if (wallc->sx2 > wallc->sx1 + 1)
		{
			x = curline->v1->fX();
			y = curline->v1->fY();
			if (wallc->sx2 == viewwidth && 0 != (den = wallc->tleft.X - wallc->tright.X - wallc->tleft.Y + wallc->tright.Y))
			{
				double frac = (wallc->tright.Y - wallc->tright.X) / den;
				x += frac * (curline->v2->fX() - x);
				y += frac * (curline->v2->fY() - y);
			}
			z2 = ViewPos.Z - plane.ZatPoint(x, y);
		}
		else
		{
			z2 = z1;
		}
	}
	else
	{
		x = curline->v1->fX();
		y = curline->v1->fY();
		if (wallc->sx1 == 0 && 0 != (den = wallc->tleft.X - wallc->tright.X + wallc->tleft.Y - wallc->tright.Y))
		{
			double frac = (wallc->tleft.Y + wallc->tleft.X) / den;
			x += frac * (curline->v2->fX() - x);
			y += frac * (curline->v2->fY() - y);
		}
		z1 = ViewPos.Z - plane.ZatPoint(x, y);

		if (wallc->sx2 > wallc->sx1 + 1)
		{
			x = curline->v2->fX();
			y = curline->v2->fY();
			if (wallc->sx2 == viewwidth && 0 != (den = wallc->tleft.X - wallc->tright.X - wallc->tleft.Y + wallc->tright.Y))
			{
				double frac = (wallc->tright.Y - wallc->tright.X) / den;
				x -= frac * (x - curline->v1->fX());
				y -= frac * (y - curline->v1->fY());
			}
			z2 = ViewPos.Z - plane.ZatPoint(x, y);
		}
		else
		{
			z2 = z1;
		}
	}

	s1 = globaluclip * wallc->sz1; s2 = globaluclip * wallc->sz2;
	s3 = globaldclip * wallc->sz1; s4 = globaldclip * wallc->sz2;
	bad = (z1<s1)+((z2<s2)<<1)+((z1>s3)<<2)+((z2>s4)<<3);

	ix1 = wallc->sx1; ix2 = wallc->sx2;
	iy1 = wallc->sz1; iy2 = wallc->sz2;
	oz1 = z1; oz2 = z2;

	if ((bad&3) == 3)
	{ // The entire line is above the screen
		memset (&mostbuf[ix1], 0, (ix2-ix1)*sizeof(mostbuf[0]));
		return bad;
	}

	if ((bad&12) == 12)
	{ // The entire line is below the screen
		clearbufshort (&mostbuf[ix1], ix2-ix1, viewheight);
		return bad;

	}

	if (bad&3)
	{ // The line intersects the top of the screen
			//inty = intz / (globaluclip>>16)
		double t = (oz1-s1) / (s2-s1+oz1-oz2);
		double inty = wallc->sz1 + t * (wallc->sz2-wallc->sz1);
		double intz = oz1 + t * (oz2-oz1);
		int xcross = wallc->sx1 + xs_RoundToInt((t * wallc->sz2 * (wallc->sx2-wallc->sx1)) / inty);

		//t = divscale30((x1<<4)-xcross*yb1[w],xcross*(yb2[w]-yb1[w])-((x2-x1)<<4));
		//inty = yb1[w] + mulscale30(yb2[w]-yb1[w],t);
		//intz = z1 + mulscale30(z2-z1,t);

		if ((bad&3) == 2)
		{ // The right side of the line is above the screen
			if (wallc->sx1 <= xcross) { z2 = intz; iy2 = inty; ix2 = xcross; }
			memset (&mostbuf[xcross], 0, (wallc->sx2-xcross)*sizeof(mostbuf[0]));
		}
		else
		{ // The left side of the line is above the screen
			if (xcross <= wallc->sx2) { z1 = intz; iy1 = inty; ix1 = xcross; }
			memset (&mostbuf[wallc->sx1], 0, (xcross-wallc->sx1)*sizeof(mostbuf[0]));
		}
	}

	if (bad&12)
	{ // The line intersects the bottom of the screen
			//inty = intz / (globaldclip>>16)
		double t = (oz1-s3) / (s4-s3+oz1-oz2);
		double inty = wallc->sz1 + t * (wallc->sz2-wallc->sz1);
		double intz = oz1 + t * (oz2-oz1);
		int xcross = wallc->sx1 + xs_RoundToInt((t * wallc->sz2 * (wallc->sx2-wallc->sx1)) / inty);

		//t = divscale30((x1<<4)-xcross*yb1[w],xcross*(yb2[w]-yb1[w])-((x2-x1)<<4));
		//inty = yb1[w] + mulscale30(yb2[w]-yb1[w],t);
		//intz = z1 + mulscale30(z2-z1,t);

		if ((bad&12) == 8)
		{ // The right side of the line is below the screen
			if (wallc->sx1 <= xcross) { z2 = intz; iy2 = inty; ix2 = xcross; }
			if (wallc->sx2 > xcross) clearbufshort (&mostbuf[xcross], wallc->sx2-xcross, viewheight);
		}
		else
		{ // The left side of the line is below the screen
			if (xcross <= wallc->sx2) { z1 = intz; iy1 = inty; ix1 = xcross; }
			if (xcross > wallc->sx1) clearbufshort (&mostbuf[wallc->sx1], xcross-wallc->sx1, viewheight);
		}
	}

	y = z1 * InvZtoScale / iy1;
	if (ix2 == ix1)
	{
		mostbuf[ix1] = (short)xs_RoundToInt(y + CenterY);
	}
	else
	{
		fixed_t yinc = FLOAT2FIXED(((z2 * InvZtoScale / iy2) - y) / (ix2-ix1));
		qinterpolatedown16short (&mostbuf[ix1], ix2-ix1, FLOAT2FIXED(y + CenterY) + FRACUNIT/2, yinc);
	}

	return bad;
}